

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

void ui_entry_insert(ui_entry *entry)

{
  wchar_t wVar1;
  ui_entry **__dest;
  wchar_t local_28;
  wchar_t local_24;
  wchar_t i;
  ui_entry **extended;
  ui_entry *puStack_10;
  wchar_t ind;
  ui_entry *entry_local;
  
  puStack_10 = entry;
  wVar1 = ui_entry_search(entry->name,(wchar_t *)((long)&extended + 4));
  if (wVar1 != L'\0') {
    quit("Attempted to insert ui_entry with same name");
  }
  if (n_entry == nalloc_entry) {
    if (L'\x3fffffff' < nalloc_entry) {
      quit("Too many ui_entry");
    }
    if (nalloc_entry == L'\0') {
      local_28 = L'\b';
    }
    else {
      local_28 = nalloc_entry << 1;
    }
    nalloc_entry = local_28;
    __dest = (ui_entry **)mem_alloc((long)local_28 << 3);
    if (L'\0' < extended._4_4_) {
      memcpy(__dest,entries,(long)extended._4_4_ << 3);
    }
    __dest[extended._4_4_] = puStack_10;
    if (extended._4_4_ < n_entry) {
      memcpy(__dest + (long)extended._4_4_ + 1,entries + extended._4_4_,
             (long)(n_entry - extended._4_4_) << 3);
    }
    mem_free(entries);
    entries = __dest;
  }
  else {
    for (local_24 = n_entry; extended._4_4_ < local_24; local_24 = local_24 + L'\xffffffff') {
      entries[local_24] = entries[local_24 + L'\xffffffff'];
    }
    entries[extended._4_4_] = puStack_10;
  }
  n_entry = n_entry + L'\x01';
  return;
}

Assistant:

static void ui_entry_insert(struct ui_entry *entry)
{
	int ind;

	if (ui_entry_search(entry->name, &ind)) {
		quit("Attempted to insert ui_entry with same name");
	}

	if (n_entry == nalloc_entry) {
		struct ui_entry **extended;

		if (nalloc_entry > INT_MAX / 2) {
			quit("Too many ui_entry");
		}
		nalloc_entry = (nalloc_entry == 0) ? 8 : 2 * nalloc_entry;
		extended = mem_alloc(nalloc_entry * sizeof(*extended));
		if (ind > 0) {
			(void) memcpy(extended, entries,
				ind * sizeof(*entries));
		}
		extended[ind] = entry;
		if (ind < n_entry) {
			(void) memcpy(extended + ind + 1, entries + ind,
				(n_entry - ind) * sizeof(*entries));
		}
		mem_free(entries);
		entries = extended;
	} else {
		int i;

		for (i = n_entry; i > ind; --i) {
			entries[i] = entries[i - 1];
		}
		entries[ind] = entry;
	}
	++n_entry;
}